

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLSLangUtils.cpp
# Opt level: O0

EShLanguage Diligent::GLSLangUtils::anon_unknown_4::ShaderTypeToShLanguage(SHADER_TYPE ShaderType)

{
  Char *pCVar1;
  undefined1 local_60 [8];
  string msg_1;
  undefined1 local_30 [8];
  string msg;
  SHADER_TYPE ShaderType_local;
  
  if (ShaderType == SHADER_TYPE_VERTEX) {
    msg.field_2._12_4_ = 0;
  }
  else if (ShaderType == SHADER_TYPE_PIXEL) {
    msg.field_2._12_4_ = 4;
  }
  else if (ShaderType == SHADER_TYPE_GEOMETRY) {
    msg.field_2._12_4_ = 3;
  }
  else if (ShaderType == SHADER_TYPE_HULL) {
    msg.field_2._12_4_ = 1;
  }
  else if (ShaderType == SHADER_TYPE_DOMAIN) {
    msg.field_2._12_4_ = 2;
  }
  else if (ShaderType == SHADER_TYPE_COMPUTE) {
    msg.field_2._12_4_ = 5;
  }
  else if (ShaderType == SHADER_TYPE_AMPLIFICATION) {
    msg.field_2._12_4_ = 0xc;
  }
  else if (ShaderType == SHADER_TYPE_MESH) {
    msg.field_2._12_4_ = 0xd;
  }
  else if (ShaderType == SHADER_TYPE_RAY_GEN) {
    msg.field_2._12_4_ = 6;
  }
  else if (ShaderType == SHADER_TYPE_RAY_MISS) {
    msg.field_2._12_4_ = 10;
  }
  else if (ShaderType == SHADER_TYPE_RAY_CLOSEST_HIT) {
    msg.field_2._12_4_ = 9;
  }
  else if (ShaderType == SHADER_TYPE_RAY_ANY_HIT) {
    msg.field_2._12_4_ = 8;
  }
  else if (ShaderType == SHADER_TYPE_RAY_INTERSECTION) {
    msg.field_2._12_4_ = 7;
  }
  else if (ShaderType == SHADER_TYPE_CALLABLE) {
    msg.field_2._12_4_ = 0xb;
  }
  else {
    msg.field_2._8_4_ = ShaderType;
    if (ShaderType == SHADER_TYPE_LAST) {
      FormatString<char[24]>((string *)local_30,(char (*) [24])"Unsupported shader type");
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"ShaderTypeToShLanguage",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/GLSLangUtils.cpp"
                 ,0x66);
      std::__cxx11::string::~string((string *)local_30);
      msg.field_2._12_4_ = 0xe;
    }
    else {
      FormatString<char[23]>((string *)local_60,(char (*) [23])"Unexpected shader type");
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"ShaderTypeToShLanguage",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/GLSLangUtils.cpp"
                 ,0x69);
      std::__cxx11::string::~string((string *)local_60);
      msg.field_2._12_4_ = 0xe;
    }
  }
  return msg.field_2._12_4_;
}

Assistant:

EShLanguage ShaderTypeToShLanguage(SHADER_TYPE ShaderType)
{
    static_assert(SHADER_TYPE_LAST == 0x4000, "Please handle the new shader type in the switch below");
    switch (ShaderType)
    {
        // clang-format off
        case SHADER_TYPE_VERTEX:           return EShLangVertex;
        case SHADER_TYPE_HULL:             return EShLangTessControl;
        case SHADER_TYPE_DOMAIN:           return EShLangTessEvaluation;
        case SHADER_TYPE_GEOMETRY:         return EShLangGeometry;
        case SHADER_TYPE_PIXEL:            return EShLangFragment;
        case SHADER_TYPE_COMPUTE:          return EShLangCompute;
        case SHADER_TYPE_AMPLIFICATION:    return EShLangTaskNV;
        case SHADER_TYPE_MESH:             return EShLangMeshNV;
        case SHADER_TYPE_RAY_GEN:          return EShLangRayGen;
        case SHADER_TYPE_RAY_MISS:         return EShLangMiss;
        case SHADER_TYPE_RAY_CLOSEST_HIT:  return EShLangClosestHit;
        case SHADER_TYPE_RAY_ANY_HIT:      return EShLangAnyHit;
        case SHADER_TYPE_RAY_INTERSECTION: return EShLangIntersect;
        case SHADER_TYPE_CALLABLE:         return EShLangCallable;
        // clang-format on
        case SHADER_TYPE_TILE:
            UNEXPECTED("Unsupported shader type");
            return EShLangCount;
        default:
            UNEXPECTED("Unexpected shader type");
            return EShLangCount;
    }
}